

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar2;
  bool bVar3;
  byte *pbVar4;
  long lVar5;
  MemoryStream *pMVar7;
  uint count;
  Member *members;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  byte *pbVar6;
  
  pMVar7 = is->is_;
  if (pMVar7->src_ != pMVar7->end_) {
    pMVar7->src_ = pMVar7->src_ + 1;
  }
  bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  pMVar7 = is->is_;
  if (bVar3) {
    pbVar4 = (byte *)pMVar7->src_;
    pbVar6 = (byte *)pMVar7->end_;
    while (((pbVar4 != pbVar6 && ((ulong)*pbVar4 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + 1;
      pMVar7->src_ = (Ch *)pbVar4;
    }
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (pbVar4 != pbVar6) {
      if (*pbVar4 == 0x7d) {
        pMVar7->src_ = (Ch *)(pbVar4 + 1);
        pcVar1 = (handler->stack_).stackTop_;
        pcVar1[-8] = '\0';
        pcVar1[-7] = '\0';
        pcVar1[-6] = '\0';
        pcVar1[-5] = '\0';
        pcVar1[-4] = '\0';
        pcVar1[-3] = '\0';
        pcVar1[-2] = '\x03';
        pcVar1[-1] = '\0';
        pcVar1[-0x10] = '\0';
        pcVar1[-0xf] = '\0';
        pcVar1[-0xe] = '\0';
        pcVar1[-0xd] = '\0';
        pcVar1[-0xc] = '\0';
        pcVar1[-0xb] = '\0';
        pcVar1[-10] = '\0';
        pcVar1[-9] = '\0';
        return;
      }
      pbVar6 = pbVar4;
      if (*pbVar4 == 0x22) {
        count = 0;
        do {
          ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pMVar7 = is->is_;
          pbVar4 = (byte *)pMVar7->src_;
          pbVar6 = (byte *)pMVar7->end_;
          while (((pbVar4 != pbVar6 && ((ulong)*pbVar4 < 0x21)) &&
                 ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
            pbVar4 = pbVar4 + 1;
            pMVar7->src_ = (Ch *)pbVar4;
          }
          if ((pbVar4 == pbVar6) || (*pbVar4 != 0x3a)) {
            lVar5 = (long)pbVar4 - (long)pMVar7->begin_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_00102e33;
          }
          do {
            pbVar4 = pbVar4 + 1;
            pMVar7->src_ = (Ch *)pbVar4;
            if ((pbVar4 == pbVar6) || (0x20 < (ulong)*pbVar4)) break;
          } while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0);
          ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pMVar7 = is->is_;
          pbVar4 = (byte *)pMVar7->src_;
          pbVar6 = (byte *)pMVar7->end_;
          while (((pbVar4 != pbVar6 && ((ulong)*pbVar4 < 0x21)) &&
                 ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
            pbVar4 = pbVar4 + 1;
            pMVar7->src_ = (Ch *)pbVar4;
          }
          if (pbVar4 == pbVar6) {
LAB_00102e82:
            pCVar2 = pMVar7->begin_;
            *(undefined4 *)(this + 0x30) = 6;
            *(long *)(this + 0x38) = (long)pbVar6 - (long)pCVar2;
            return;
          }
          count = count + 1;
          if (*pbVar4 != 0x2c) {
            pbVar6 = pbVar4;
            if (*pbVar4 == 0x7d) {
              pMVar7->src_ = (Ch *)(pbVar4 + 1);
              allocator = handler->allocator_;
              pcVar1 = (handler->stack_).stackTop_;
              members = (Member *)(pcVar1 + (ulong)count * -0x20);
              (handler->stack_).stackTop_ = (char *)members;
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)(pcVar1 + (ulong)count * -0x20 + -0x10),members,count,allocator);
              return;
            }
            goto LAB_00102e82;
          }
          do {
            pbVar4 = pbVar4 + 1;
            pMVar7->src_ = (Ch *)pbVar4;
            if ((pbVar4 == pbVar6) || (0x20 < (ulong)*pbVar4)) break;
          } while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0);
        } while ((pbVar4 != pbVar6) && (pbVar6 = pbVar4, *pbVar4 == 0x22));
      }
    }
    lVar5 = (long)pbVar6 - (long)pMVar7->begin_;
    *(undefined4 *)(this + 0x30) = 4;
  }
  else {
    lVar5 = (long)pMVar7->src_ - (long)pMVar7->begin_;
    *(undefined4 *)(this + 0x30) = 0x10;
  }
LAB_00102e33:
  *(long *)(this + 0x38) = lVar5;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }